

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * fts5ConfigSkipLiteral(char *pIn)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *local_18;
  char *p;
  char *pIn_local;
  
  cVar1 = *pIn;
  if (cVar1 == '\'') {
    local_18 = pIn + 1;
    while( true ) {
      if (local_18 == (char *)0x0) {
        return (char *)0x0;
      }
      if ((*local_18 == '\'') && (local_18 = local_18 + 1, *local_18 != '\'')) break;
      local_18 = local_18 + 1;
      if (*local_18 == '\0') {
        local_18 = (char *)0x0;
      }
    }
    return local_18;
  }
  if (cVar1 == 'N') {
LAB_001f2374:
    iVar3 = sqlite3_strnicmp("null",pIn,4);
    if (iVar3 == 0) {
      local_18 = pIn + 4;
    }
    else {
      local_18 = (char *)0x0;
    }
  }
  else {
    if (cVar1 != 'X') {
      if (cVar1 == 'n') goto LAB_001f2374;
      if (cVar1 != 'x') {
        if ((*pIn == '+') || (local_18 = pIn, *pIn == '-')) {
          local_18 = pIn + 1;
        }
        while (iVar3 = fts5_isdigit(*local_18), iVar3 != 0) {
          local_18 = local_18 + 1;
        }
        if ((*local_18 == '.') && (iVar3 = fts5_isdigit(local_18[1]), iVar3 != 0)) {
          local_18 = local_18 + 2;
          while (iVar3 = fts5_isdigit(*local_18), iVar3 != 0) {
            local_18 = local_18 + 1;
          }
        }
        if (local_18 != pIn) {
          return local_18;
        }
        return (char *)0x0;
      }
    }
    if (pIn[1] == '\'') {
      local_18 = pIn + 2;
      while( true ) {
        if ((((*local_18 < 'a') || (bVar2 = true, 'f' < *local_18)) &&
            ((*local_18 < 'A' || (bVar2 = true, 'F' < *local_18)))) &&
           (bVar2 = false, '/' < *local_18)) {
          bVar2 = *local_18 < ':';
        }
        if (!bVar2) break;
        local_18 = local_18 + 1;
      }
      if ((*local_18 == '\'') && (((long)local_18 - (long)pIn) % 2 == 0)) {
        local_18 = local_18 + 1;
      }
      else {
        local_18 = (char *)0x0;
      }
    }
    else {
      local_18 = (char *)0x0;
    }
  }
  return local_18;
}

Assistant:

static const char *fts5ConfigSkipLiteral(const char *pIn){
  const char *p = pIn;
  switch( *p ){
    case 'n': case 'N':
      if( sqlite3_strnicmp("null", p, 4)==0 ){
        p = &p[4];
      }else{
        p = 0;
      }
      break;

    case 'x': case 'X':
      p++;
      if( *p=='\'' ){
        p++;
        while( (*p>='a' && *p<='f') 
            || (*p>='A' && *p<='F') 
            || (*p>='0' && *p<='9') 
            ){
          p++;
        }
        if( *p=='\'' && 0==((p-pIn)%2) ){
          p++;
        }else{
          p = 0;
        }
      }else{
        p = 0;
      }
      break;

    case '\'':
      p++;
      while( p ){
        if( *p=='\'' ){
          p++;
          if( *p!='\'' ) break;
        }
        p++;
        if( *p==0 ) p = 0;
      }
      break;

    default:
      /* maybe a number */
      if( *p=='+' || *p=='-' ) p++;
      while( fts5_isdigit(*p) ) p++;

      /* At this point, if the literal was an integer, the parse is 
      ** finished. Or, if it is a floating point value, it may continue
      ** with either a decimal point or an 'E' character. */
      if( *p=='.' && fts5_isdigit(p[1]) ){
        p += 2;
        while( fts5_isdigit(*p) ) p++;
      }
      if( p==pIn ) p = 0;

      break;
  }

  return p;
}